

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_sit.cpp
# Opt level: O0

void ucol_sit_initCollatorSpecs(CollatorSpec *spec)

{
  int local_14;
  int32_t i;
  CollatorSpec *spec_local;
  
  memset(spec,0,0x348);
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    spec->options[local_14] = UCOL_DEFAULT;
  }
  return;
}

Assistant:

static
void ucol_sit_initCollatorSpecs(CollatorSpec *spec)
{
    // reset everything
    uprv_memset(spec, 0, sizeof(CollatorSpec));
    // set collation options to default
    int32_t i = 0;
    for(i = 0; i < UCOL_ATTRIBUTE_COUNT; i++) {
        spec->options[i] = UCOL_DEFAULT;
    }
}